

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

RowSetEntry * rowSetEntryAlloc(RowSet *p)

{
  RowSetEntry *pRVar1;
  RowSetChunk *pRVar2;
  RowSetChunk *pNew;
  RowSet *p_local;
  
  if (p->nFresh == 0) {
    pRVar2 = (RowSetChunk *)sqlite3DbMallocRawNN(p->db,0x3f8);
    if (pRVar2 == (RowSetChunk *)0x0) {
      return (RowSetEntry *)0x0;
    }
    pRVar2->pNextChunk = p->pChunk;
    p->pChunk = pRVar2;
    p->pFresh = pRVar2->aEntry;
    p->nFresh = 0x2a;
  }
  p->nFresh = p->nFresh - 1;
  pRVar1 = p->pFresh;
  p->pFresh = pRVar1 + 1;
  return pRVar1;
}

Assistant:

static struct RowSetEntry *rowSetEntryAlloc(RowSet *p){
  assert( p!=0 );
  if( p->nFresh==0 ){  /*OPTIMIZATION-IF-FALSE*/
    /* We could allocate a fresh RowSetEntry each time one is needed, but it
    ** is more efficient to pull a preallocated entry from the pool */
    struct RowSetChunk *pNew;
    pNew = sqlite3DbMallocRawNN(p->db, sizeof(*pNew));
    if( pNew==0 ){
      return 0;
    }
    pNew->pNextChunk = p->pChunk;
    p->pChunk = pNew;
    p->pFresh = pNew->aEntry;
    p->nFresh = ROWSET_ENTRY_PER_CHUNK;
  }
  p->nFresh--;
  return p->pFresh++;
}